

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O0

void __thiscall
cppjieba::MPSegment::Cut
          (MPSegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *words,
          size_t max_word_len)

{
  undefined1 local_48 [8];
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> dags;
  size_t max_word_len_local;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *words_local;
  const_iterator end_local;
  const_iterator begin_local;
  MPSegment *this_local;
  
  dags.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)max_word_len;
  std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::vector
            ((vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *)local_48);
  DictTrie::Find(this->dictTrie_,begin,end,
                 (vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *)local_48,
                 (size_t)dags.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
  CalcDP(this,(vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *)local_48);
  CutByDag(this,begin,end,(vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *)local_48,words);
  std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::~vector
            ((vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *)local_48);
  return;
}

Assistant:

void Cut(RuneStrArray::const_iterator begin,
           RuneStrArray::const_iterator end,
           vector<WordRange>& words,
           size_t max_word_len = MAX_WORD_LENGTH) const {
    vector<Dag> dags;
    dictTrie_->Find(begin, 
          end, 
          dags,
          max_word_len);
    CalcDP(dags);
    CutByDag(begin, end, dags, words);
  }